

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void tfm_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  uint16_t *in_RDX;
  MCInst *in_RSI;
  undefined8 in_RDI;
  m680x_info *unaff_retaddr;
  uint8_t index;
  uint8_t regs;
  uint8_t local_19;
  
  local_19 = '\0';
  read_byte((m680x_info *)in_RSI,&local_19,*in_RDX);
  add_indexed_operand(unaff_retaddr,(m680x_reg)((ulong)in_RDI >> 0x20),
                      SUB81((ulong)in_RDI >> 0x18,0),(uint8_t)((ulong)in_RDI >> 0x10),
                      (uint8_t)((ulong)in_RDI >> 8),(uint16_t)((ulong)in_RSI >> 0x30),
                      SUB81((ulong)in_RSI >> 0x28,0));
  add_indexed_operand(unaff_retaddr,(m680x_reg)((ulong)in_RDI >> 0x20),
                      SUB81((ulong)in_RDI >> 0x18,0),(uint8_t)((ulong)in_RDI >> 0x10),
                      (uint8_t)((ulong)in_RDI >> 8),(uint16_t)((ulong)in_RSI >> 0x30),
                      SUB81((ulong)in_RSI >> 0x28,0));
  add_reg_to_rw_list(in_RSI,(m680x_reg)((ulong)in_RDX >> 0x20),(e_access)in_RDX);
  return;
}

Assistant:

static void tfm_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	static const uint8_t inc_dec_r0[] = {
		1, -1, 1, 0,
	};
	static const uint8_t inc_dec_r1[] = {
		1, -1, 0, 1,
	};
	uint8_t regs = 0;
	uint8_t index = (MI->Opcode & 0xff) - 0x38;

	read_byte(info, &regs, *address);

	add_indexed_operand(info, g_tfr_exg_reg_ids[regs >> 4], true,
		inc_dec_r0[index], M680X_OFFSET_NONE, 0, true);
	add_indexed_operand(info, g_tfr_exg_reg_ids[regs & 0x0f], true,
		inc_dec_r1[index], M680X_OFFSET_NONE, 0, true);

	add_reg_to_rw_list(MI, M680X_REG_W, READ | WRITE);
}